

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O1

shared_ptr<SearchBase> __thiscall findstr::makesearcher(findstr *this)

{
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  shared_ptr<SearchBase> sVar2;
  undefined1 local_29;
  masksearch *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  switch(*(undefined4 *)(in_RSI + 0x20)) {
  case 0:
    local_28 = (masksearch *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<regexsearcher,std::allocator<regexsearcher>,std::__cxx11::string&,bool&>
              (&local_20,(regexsearcher **)&local_28,(allocator<regexsearcher> *)&local_29,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x28),
               (bool *)(in_RSI + 2));
    _Var1._M_pi = extraout_RDX;
    break;
  case 1:
    local_28 = (masksearch *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<stringsearch<std::default_searcher<char_const*,std::equal_to<void>>>,std::allocator<stringsearch<std::default_searcher<char_const*,std::equal_to<void>>>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_20,
               (stringsearch<std::default_searcher<const_char_*,_std::equal_to<void>_>_> **)
               &local_28,
               (allocator<stringsearch<std::default_searcher<const_char_*,_std::equal_to<void>_>_>_>
                *)&local_29,
               (vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)(in_RSI + 0x48));
    _Var1._M_pi = extraout_RDX_04;
    break;
  case 2:
    local_28 = (masksearch *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<stringsearch<std::boyer_moore_searcher<char_const*,std::hash<char>,std::equal_to<void>>>,std::allocator<stringsearch<std::boyer_moore_searcher<char_const*,std::hash<char>,std::equal_to<void>>>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_20,
               (stringsearch<std::boyer_moore_searcher<const_char_*,_std::hash<char>,_std::equal_to<void>_>_>
                **)&local_28,
               (allocator<stringsearch<std::boyer_moore_searcher<const_char_*,_std::hash<char>,_std::equal_to<void>_>_>_>
                *)&local_29,
               (vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)(in_RSI + 0x48));
    _Var1._M_pi = extraout_RDX_01;
    break;
  case 3:
    local_28 = (masksearch *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<stringsearch<std::boyer_moore_horspool_searcher<char_const*,std::hash<char>,std::equal_to<void>>>,std::allocator<stringsearch<std::boyer_moore_horspool_searcher<char_const*,std::hash<char>,std::equal_to<void>>>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_20,
               (stringsearch<std::boyer_moore_horspool_searcher<const_char_*,_std::hash<char>,_std::equal_to<void>_>_>
                **)&local_28,
               (allocator<stringsearch<std::boyer_moore_horspool_searcher<const_char_*,_std::hash<char>,_std::equal_to<void>_>_>_>
                *)&local_29,
               (vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)(in_RSI + 0x48));
    _Var1._M_pi = extraout_RDX_02;
    break;
  case 4:
    local_28 = (masksearch *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<stringsearch<boost::algorithm::boyer_moore<char_const*,boost::algorithm::detail::BM_traits<char_const*>>>,std::allocator<stringsearch<boost::algorithm::boyer_moore<char_const*,boost::algorithm::detail::BM_traits<char_const*>>>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_20,
               (stringsearch<boost::algorithm::boyer_moore<const_char_*,_boost::algorithm::detail::BM_traits<const_char_*>_>_>
                **)&local_28,
               (allocator<stringsearch<boost::algorithm::boyer_moore<const_char_*,_boost::algorithm::detail::BM_traits<const_char_*>_>_>_>
                *)&local_29,
               (vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)(in_RSI + 0x48));
    _Var1._M_pi = extraout_RDX_00;
    break;
  case 5:
    local_28 = (masksearch *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<stringsearch<boost::algorithm::boyer_moore_horspool<char_const*,boost::algorithm::detail::BM_traits<char_const*>>>,std::allocator<stringsearch<boost::algorithm::boyer_moore_horspool<char_const*,boost::algorithm::detail::BM_traits<char_const*>>>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_20,
               (stringsearch<boost::algorithm::boyer_moore_horspool<const_char_*,_boost::algorithm::detail::BM_traits<const_char_*>_>_>
                **)&local_28,
               (allocator<stringsearch<boost::algorithm::boyer_moore_horspool<const_char_*,_boost::algorithm::detail::BM_traits<const_char_*>_>_>_>
                *)&local_29,
               (vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)(in_RSI + 0x48));
    _Var1._M_pi = extraout_RDX_05;
    break;
  case 6:
    local_28 = (masksearch *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<stringsearch<boost::algorithm::knuth_morris_pratt<char_const*>>,std::allocator<stringsearch<boost::algorithm::knuth_morris_pratt<char_const*>>>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_20,
               (stringsearch<boost::algorithm::knuth_morris_pratt<const_char_*>_> **)&local_28,
               (allocator<stringsearch<boost::algorithm::knuth_morris_pratt<const_char_*>_>_> *)
               &local_29,
               (vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)(in_RSI + 0x48));
    _Var1._M_pi = extraout_RDX_06;
    break;
  case 7:
    local_28 = (masksearch *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<masksearch,std::allocator<masksearch>,std::vector<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&>
              (&local_20,&local_28,(allocator<masksearch> *)&local_29,
               (vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)(in_RSI + 0x48));
    _Var1._M_pi = extraout_RDX_03;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unknown searchtype");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(masksearch **)this = local_28;
  this->verbose = 0;
  this->list_only = false;
  this->count_only = false;
  this->readcontinuous = false;
  this->use_sequential = false;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->verbose = local_20._M_pi;
  sVar2.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<SearchBase>)sVar2.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SearchBase> makesearcher()
    {
        switch(searchtype) {
        case REGEX_SEARCH:
            return std::make_shared<regexsearcher>(pattern, matchcase);
        case STD_SEARCH:
            return std::make_shared<stringsearch<std::default_searcher<const char*>>>(bytemasks);
        case STD_BOYER_MOORE:
            return std::make_shared<stringsearch<SEARCHERNS::boyer_moore_searcher<const char*>>>(bytemasks);
        case STD_BOYER_MOORE_HORSPOOL:
            return std::make_shared<stringsearch<SEARCHERNS::boyer_moore_horspool_searcher<const char*>>>(bytemasks);
#ifdef USE_BOOST_REGEX
        case BOOST_BOYER_MOORE:
            return std::make_shared<stringsearch<boost::algorithm::boyer_moore<const char*>>>(bytemasks);
        case BOOST_BOYER_MOORE_HORSPOOL:
            return std::make_shared<stringsearch<boost::algorithm::boyer_moore_horspool<const char*>>>(bytemasks);
        case BOOST_KNUTH_MORRIS_PRATT:
            return std::make_shared<stringsearch<boost::algorithm::knuth_morris_pratt<const char*>>>(bytemasks);
#endif
        case BYTEMASK_SEARCH:
            return std::make_shared<masksearch>(bytemasks);
        }
        throw std::runtime_error("unknown searchtype");
    }